

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvertStreams<short>
          (RendererImpl<float> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  Bit32u len_00;
  DACOutputStreams<short> tmpStreams;
  DACOutputStreams<float> cnvStreams;
  float cnvReverbWetRight [4096];
  float cnvReverbWetLeft [4096];
  float cnvReverbDryRight [4096];
  float cnvReverbDryLeft [4096];
  float cnvNonReverbRight [4096];
  float cnvNonReverbLeft [4096];
  DACOutputStreams<short> DStack_18098;
  DACOutputStreams<float> DStack_18068;
  float afStack_18038 [4096];
  float afStack_14038 [4096];
  float afStack_10038 [4096];
  float local_c038 [4096];
  float local_8038 [4096];
  float local_4038 [4098];
  
  DStack_18068.nonReverbLeft = local_4038;
  DStack_18068.nonReverbRight = local_8038;
  DStack_18068.reverbDryLeft = local_c038;
  DStack_18068.reverbDryRight = afStack_10038;
  DStack_18068.reverbWetLeft = afStack_14038;
  DStack_18068.reverbWetRight = afStack_18038;
  DStack_18098.nonReverbLeft = streams->nonReverbLeft;
  DStack_18098.nonReverbRight = streams->nonReverbRight;
  DStack_18098.reverbDryLeft = streams->reverbDryLeft;
  DStack_18098.reverbDryRight = streams->reverbDryRight;
  DStack_18098.reverbWetLeft = streams->reverbWetLeft;
  DStack_18098.reverbWetRight = streams->reverbWetRight;
  for (; len != 0; len = len - len_00) {
    len_00 = 0x1000;
    if (len < 0x1000) {
      len_00 = len;
    }
    doRenderStreams(this,&DStack_18068,len_00);
    convertSampleFormat<float,short>(DStack_18068.nonReverbLeft,DStack_18098.nonReverbLeft,len_00);
    convertSampleFormat<float,short>(DStack_18068.nonReverbRight,DStack_18098.nonReverbRight,len_00)
    ;
    convertSampleFormat<float,short>(DStack_18068.reverbDryLeft,DStack_18098.reverbDryLeft,len_00);
    convertSampleFormat<float,short>(DStack_18068.reverbDryRight,DStack_18098.reverbDryRight,len_00)
    ;
    convertSampleFormat<float,short>(DStack_18068.reverbWetLeft,DStack_18098.reverbWetLeft,len_00);
    convertSampleFormat<float,short>(DStack_18068.reverbWetRight,DStack_18098.reverbWetRight,len_00)
    ;
    advanceStreams<short>(&DStack_18098,len_00);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}